

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int __thiscall JetHead::File::close(File *this,int __fd)

{
  int iVar1;
  int *piVar2;
  int res;
  File *this_local;
  
  if (this->mFd == -1) {
    this_local._4_4_ = kNotInitialized;
  }
  else {
    iVar1 = ::close(this->mFd);
    this->mFd = -1;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      this_local._4_4_ = getErrorCode(*piVar2);
    }
    else {
      this_local._4_4_ = kNoError;
    }
  }
  return this_local._4_4_;
}

Assistant:

JetHead::ErrCode File::close()
{
	TRACE_BEGIN(LOG_LVL_INFO);
	LOG_INFO( "fd %d", mFd );
	if ( mFd != -1 )
	{
		int res = ::close( mFd );
		mFd = -1;
		if ( res == -1 )
		{
			return getErrorCode( errno );
		}
	}
	else
		return JetHead::kNotInitialized;

	return JetHead::kNoError;
}